

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QRenderRule::drawBackground(QRenderRule *this,QPainter *p,QRect *rect,QPoint *off)

{
  bool bVar1;
  BrushStyle BVar2;
  QStyleSheetBackgroundData *pQVar3;
  ulong uVar4;
  QPainterPath *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  bool wasAntialiased;
  QPainterPath *borderPath;
  Origin origin;
  QBrush brush;
  undefined8 in_stack_000000a0;
  QRect *in_stack_000000a8;
  QPainter *in_stack_000000b0;
  QRenderRule *in_stack_000000b8;
  QPoint in_stack_00000158;
  undefined8 in_stack_ffffffffffffff68;
  RenderHint other;
  undefined4 in_stack_ffffffffffffff70;
  Origin OVar6;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 in_stack_ffffffffffffff88 [16];
  undefined1 auVar7 [12];
  QRenderRule *this_00;
  QRect local_30;
  undefined4 local_20;
  QFlagsStorageHelper<QPainter::RenderHint,_4> local_1c;
  undefined1 local_18 [16];
  long local_8;
  
  other = (RenderHint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  auVar7 = in_stack_ffffffffffffff88._4_12_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = hasBackground((QRenderRule *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
                       );
  if (bVar1) {
    pQVar3 = background((QRenderRule *)0x42560e);
    QBrush::QBrush((QBrush *)(local_18 + 8),&pQVar3->brush);
  }
  else {
    QBrush::QBrush((QBrush *)(local_18 + 8));
  }
  BVar2 = QBrush::style((QBrush *)0x42563e);
  if (BVar2 == NoBrush) {
    QBrush::operator=((QBrush *)(local_18 + 8),(QBrush *)(in_RDI + 8));
  }
  BVar2 = QBrush::style((QBrush *)0x425666);
  if (BVar2 != NoBrush) {
    bVar1 = hasBackground((QRenderRule *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    if (bVar1) {
      pQVar3 = background((QRenderRule *)0x425689);
      OVar6 = pQVar3->clip;
    }
    else {
      OVar6 = Origin_Border;
    }
    QVar5 = originRect((QRenderRule *)&DAT_aaaaaaaaaaaaaaaa,auVar7._4_8_,auVar7._0_4_);
    auVar7 = QVar5._4_12_;
    QVar5._8_8_ = in_stack_000000a8;
    QVar5._0_8_ = in_stack_000000a0;
    borderClip((QRenderRule *)p,QVar5);
    this_00 = (QRenderRule *)local_18;
    uVar4 = QPainterPath::isEmpty();
    if ((uVar4 & 1) == 0) {
      local_20 = QPainter::renderHints();
      local_1c.super_QFlagsStorage<QPainter::RenderHint>.i =
           (QFlagsStorage<QPainter::RenderHint>)
           QFlags<QPainter::RenderHint>::operator&
                     ((QFlags<QPainter::RenderHint> *)CONCAT44(OVar6,in_stack_ffffffffffffff70),
                      other);
      ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
      QPainter::setRenderHint((RenderHint)in_RSI,true);
      QPainter::fillPath(in_RSI,(QBrush *)this_00);
      QPainter::setRenderHint((RenderHint)in_RSI,true);
    }
    else {
      local_30 = originRect(this_00,auVar7._4_8_,auVar7._0_4_);
      QPainter::fillRect((QRect *)in_RSI,(QBrush *)&local_30);
    }
    QPainterPath::~QPainterPath((QPainterPath *)local_18);
  }
  drawBackgroundImage(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_00000158);
  QBrush::~QBrush((QBrush *)(local_18 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::drawBackground(QPainter *p, const QRect& rect, const QPoint& off)
{
    QBrush brush = hasBackground() ? background()->brush : QBrush();
    if (brush.style() == Qt::NoBrush)
        brush = defaultBackground;

    if (brush.style() != Qt::NoBrush) {
        Origin origin = hasBackground() ? background()->clip : Origin_Border;
        // ### fix for  gradients
        const QPainterPath &borderPath = borderClip(originRect(rect, origin));
        if (!borderPath.isEmpty()) {
            // Drawn instead of being used as clipping path for better visual quality
            bool wasAntialiased = p->renderHints() & QPainter::Antialiasing;
            p->setRenderHint(QPainter::Antialiasing);
            p->fillPath(borderPath, brush);
            p->setRenderHint(QPainter::Antialiasing, wasAntialiased);
        } else {
            p->fillRect(originRect(rect, origin), brush);
        }
    }

    drawBackgroundImage(p, rect, off);
}